

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O2

bool __thiscall
spvtools::val::Construct::IsStructuredExit(Construct *this,ValidationState_t *_,BasicBlock *dest)

{
  uint16_t uVar1;
  ValidationState_t *other;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  BasicBlock *pBVar5;
  bool bVar6;
  Instruction *pIVar7;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar8;
  
  switch(this->type_) {
  case kSelection:
    if (this->exit_block_ == dest) {
      return true;
    }
    other = (ValidationState_t *)this->entry_block_;
    pBVar5 = IsStructuredExit::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)other,(BasicBlock *)_);
    bVar6 = false;
    for (; pBVar5 != (BasicBlock *)0x0;
        pBVar5 = IsStructuredExit::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)pBVar5,(BasicBlock *)_)) {
      pIVar7 = pBVar5->terminator_;
      uVar1 = pIVar7[-1].inst_.opcode;
      if ((uVar1 == 0xf6) ||
         (((uVar1 == 0xf7 &&
           (*(short *)((long)&(other->unresolved_forward_ids_)._M_h._M_single_bucket[7]._M_nxt + 2)
            != 0xfb)) && ((pIVar7->inst_).opcode == 0xfb)))) {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar7 + -1,0);
        pVar8 = val::Function::GetBlock(pIVar7[-1].function_,uVar3);
        _ = other;
        bVar2 = BasicBlock::structurally_dominates(pVar8.first,(BasicBlock *)other);
        if (!bVar2) {
          if ((bVar6) && (pIVar7[-1].inst_.opcode != 0xf6)) {
LAB_005703bd:
            uVar1 = (pIVar7->inst_).opcode;
          }
          else {
            if (dest->id_ == uVar3) {
              return true;
            }
            if (pIVar7[-1].inst_.opcode != 0xf6) goto LAB_005703bd;
            _ = (ValidationState_t *)0x1;
            uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar7 + -1,1);
            if (dest->id_ == uVar3) {
              return true;
            }
            uVar1 = (pIVar7->inst_).opcode;
            if (pIVar7[-1].inst_.opcode == 0xf6) {
              return false;
            }
          }
          bVar6 = (bool)(bVar6 | uVar1 == 0xfb);
        }
      }
    }
    break;
  case kContinue:
    pBVar5 = (*(this->corresponding_constructs_).
               super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->entry_block_;
    uVar3 = Instruction::GetOperandAs<unsigned_int>(pBVar5->terminator_ + -1,0);
    if (pBVar5 == dest) {
      return true;
    }
    if (dest->id_ == uVar3) {
      return true;
    }
    break;
  case kLoop:
    pIVar7 = this->entry_block_->terminator_ + -1;
    uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar7,0);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar7,1);
    if (dest->id_ == uVar3) {
      return true;
    }
    if (dest->id_ == uVar4) {
      return true;
    }
    break;
  case kCase:
    __assert_fail("type() != ConstructType::kCase",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x86,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  default:
    __assert_fail("type() == ConstructType::kSelection",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x9c,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  }
  return false;
}

Assistant:

ConstructType Construct::type() const { return type_; }